

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_21;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_22;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_23;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_24;
  initializer_list<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __l_25;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ostream *poVar4;
  ssize_t sVar5;
  ulong __nbytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1ce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1cb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1480;
  undefined1 local_1460 [8];
  string line;
  undefined1 local_1438 [7];
  bool success;
  string read_string;
  string token;
  Tokenizer tokenizer;
  Parser parser;
  vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
  table;
  ParseTableCalculation table_calculation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  string local_1228 [32];
  iterator local_1208;
  size_type local_1200;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_11f4 [2];
  allocator local_11f2;
  allocator local_11f1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  string local_11c8 [32];
  iterator local_11a8;
  size_type local_11a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1194 [2];
  allocator local_1192;
  allocator local_1191 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1188;
  string local_1168 [32];
  iterator local_1148;
  size_type local_1140;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1134 [2];
  allocator local_1132;
  allocator local_1131 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1128;
  string local_1108 [32];
  iterator local_10e8;
  size_type local_10e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10d6 [2];
  allocator local_10d4;
  allocator local_10d3;
  allocator local_10d2;
  allocator local_10d1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c8;
  string local_10a8 [32];
  string local_1088 [32];
  string local_1068 [32];
  iterator local_1048;
  size_type local_1040;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1036 [2];
  allocator local_1034;
  allocator local_1033;
  allocator local_1032;
  allocator local_1031 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1028;
  string local_1008 [32];
  string local_fe8 [32];
  string local_fc8 [32];
  iterator local_fa8;
  size_type local_fa0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f96 [2];
  allocator local_f94;
  allocator local_f93;
  allocator local_f92;
  allocator local_f91 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f88;
  string local_f68 [32];
  string local_f48 [32];
  string local_f28 [32];
  iterator local_f08;
  size_type local_f00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ef6 [2];
  allocator local_ef4;
  allocator local_ef3;
  allocator local_ef2;
  allocator local_ef1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee8;
  string local_ec8 [32];
  string local_ea8 [32];
  string local_e88 [32];
  iterator local_e68;
  size_type local_e60;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e56 [2];
  allocator local_e54;
  allocator local_e53;
  allocator local_e52;
  allocator local_e51 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e48;
  string local_e28 [32];
  string local_e08 [32];
  string local_de8 [32];
  iterator local_dc8;
  size_type local_dc0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_db5 [2];
  allocator local_db3;
  allocator local_db2;
  allocator local_db1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  string local_d88 [32];
  string local_d68 [32];
  iterator local_d48;
  size_type local_d40;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d35 [2];
  allocator local_d33;
  allocator local_d32;
  allocator local_d31 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  string local_d08 [32];
  string local_ce8 [32];
  iterator local_cc8;
  size_type local_cc0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cb4 [2];
  allocator local_cb2;
  allocator local_cb1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  string local_c88 [32];
  iterator local_c68;
  size_type local_c60;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c54 [2];
  allocator local_c52;
  allocator local_c51 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  string local_c28 [32];
  iterator local_c08;
  size_type local_c00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf6 [2];
  allocator local_bf4;
  allocator local_bf3;
  allocator local_bf2;
  allocator local_bf1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  string local_bc8 [32];
  string local_ba8 [32];
  string local_b88 [32];
  iterator local_b68;
  size_type local_b60;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b55 [2];
  allocator local_b53;
  allocator local_b52;
  allocator local_b51 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  string local_b28 [32];
  string local_b08 [32];
  iterator local_ae8;
  size_type local_ae0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ad6 [2];
  allocator local_ad4;
  allocator local_ad3;
  allocator local_ad2;
  allocator local_ad1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  iterator local_a48;
  size_type local_a40;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a36 [2];
  allocator local_a34;
  allocator local_a33;
  allocator local_a32;
  allocator local_a31 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  iterator local_9a8;
  size_type local_9a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_996 [2];
  allocator local_994;
  allocator local_993;
  allocator local_992;
  allocator local_991 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  iterator local_908;
  size_type local_900;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f4 [2];
  allocator local_8f2;
  allocator local_8f1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  string local_8c8 [32];
  iterator local_8a8;
  size_type local_8a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_894 [2];
  allocator local_892;
  allocator local_891 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  string local_868 [32];
  iterator local_848;
  size_type local_840;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_836 [2];
  allocator local_834;
  allocator local_833;
  allocator local_832;
  allocator local_831 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  iterator local_7a8;
  size_type local_7a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_795 [2];
  allocator local_793;
  allocator local_792;
  allocator local_791 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  string local_768 [32];
  string local_748 [32];
  iterator local_728;
  size_type local_720;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_714 [2];
  allocator local_712;
  allocator local_711 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  string local_6e8 [32];
  iterator local_6c8;
  size_type local_6c0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b5 [2];
  allocator local_6b3;
  allocator local_6b2;
  allocator local_6b1 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  string local_688 [32];
  string local_668 [32];
  iterator local_648;
  size_type local_640;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_636 [2];
  allocator local_634;
  allocator local_633;
  allocator local_632;
  allocator local_631 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  iterator local_5a8;
  size_type local_5a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_595 [2];
  allocator local_593;
  allocator local_592;
  allocator local_591 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568 [32];
  string local_548 [32];
  iterator local_528;
  size_type local_520;
  undefined1 local_518 [8];
  undefined1 local_510 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_420;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_2a0 [24];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  rules;
  string filename;
  allocator local_249;
  key_type local_248;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_228;
  byte local_219;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_218;
  bool print_ast;
  allocator local_209;
  key_type local_208;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1e0;
  allocator local_1d1;
  key_type local_1d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1b0;
  byte local_1a1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_1a0;
  bool print_parser_debug;
  allocator local_191;
  key_type local_190;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_170;
  byte local_161;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_160;
  bool print_table_calculation_debug;
  allocator local_151;
  key_type local_150;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_130;
  byte local_122;
  allocator local_121;
  undefined1 local_120 [6];
  bool print_tokenizer_debug;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_100;
  allocator local_f1;
  key_type local_f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_d0;
  iterator it_filename;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_c0;
  allocator local_b1;
  key_type local_b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_90 [3];
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  char **argv_local;
  int argc_local;
  
  args._M_h._M_single_bucket = (__node_base_ptr)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"filename",&local_71);
  parseArguments((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_50,&local_70,argc,(char **)args._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"help",&local_b1);
  local_90[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_50,&local_b0);
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  bVar1 = std::__detail::operator!=(local_90,&local_c0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  if (bVar1) {
    printHelp();
    argv_local._4_4_ = 0;
    it_filename.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._4_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"filename",&local_f1);
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_50,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    local_100._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_50);
    bVar1 = std::__detail::operator==(&local_d0,&local_100);
    if (bVar1) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_120,"No file provided",&local_121);
      printError((string *)local_120);
      std::__cxx11::string::~string((string *)local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      printHelp();
      argv_local._4_4_ = -1;
      it_filename.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_150,"tokenizer_debug",&local_151);
      local_130._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50,&local_150);
      _Stack_160._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_50);
      bVar1 = std::__detail::operator!=(&local_130,&stack0xfffffffffffffea0);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      local_122 = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"table_debug",&local_191);
      local_170._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50,&local_190);
      _Stack_1a0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_50);
      bVar1 = std::__detail::operator!=(&local_170,&stack0xfffffffffffffe60);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      local_161 = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d0,"parser_debug",&local_1d1);
      local_1b0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50,&local_1d0);
      local_1e0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_50);
      bVar1 = std::__detail::operator!=(&local_1b0,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      local_1a1 = bVar1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_208,"debug",&local_209);
      local_1e8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50,&local_208);
      _Stack_218._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_50);
      bVar1 = std::__detail::operator!=(&local_1e8,&stack0xfffffffffffffde8);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      if (bVar1) {
        local_122 = 1;
        local_161 = 1;
        local_1a1 = 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_248,"ast",&local_249);
      local_228._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50,&local_248);
      filename.field_2._8_8_ =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_50);
      bVar1 = std::__detail::operator!=
                        (&local_228,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          *)((long)&filename.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      local_219 = bVar1;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)&local_d0);
      std::__cxx11::string::string
                ((string *)
                 &rules.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&ppVar3->second);
      table_calculation.non_terminal_first_sets_._M_h._M_single_bucket._3_1_ = 1;
      local_518 = (undefined1  [8])local_510;
      local_595[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_591._1_8_ = &local_588;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_588,"program",local_591);
      local_591._1_8_ = local_568;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_568,"commands",&local_592);
      local_591._1_8_ = local_548;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_548,"EOF",&local_593);
      local_595[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_528 = &local_588;
      local_520 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_595);
      __l_24._M_len = local_520;
      __l_24._M_array = local_528;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_510,__l_24,local_595);
      local_636[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_631._1_8_ = &local_628;
      local_518 = (undefined1  [8])(local_510 + 0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_628,"commands",local_631);
      local_631._1_8_ = local_608;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_608,"command",&local_632);
      local_631._1_8_ = local_5e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e8,"SEMICOLON",&local_633);
      local_631._1_8_ = local_5c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c8,"commands",&local_634);
      local_636[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_5a8 = &local_628;
      local_5a0 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_636);
      __l_23._M_len = local_5a0;
      __l_23._M_array = local_5a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_510 + 0x18),__l_23,local_636);
      local_6b5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_6b1._1_8_ = &local_6a8;
      local_518 = (undefined1  [8])&local_4e0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6a8,"commands",local_6b1);
      local_6b1._1_8_ = local_688;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_688,"block",&local_6b2);
      local_6b1._1_8_ = local_668;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_668,"commands",&local_6b3);
      local_6b5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_648 = &local_6a8;
      local_640 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_6b5);
      __l_22._M_len = local_640;
      __l_22._M_array = local_648;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4e0,__l_22,local_6b5);
      local_714[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_711._1_8_ = &local_708;
      local_518 = (undefined1  [8])&local_4c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_708,"commands",local_711);
      local_711._1_8_ = local_6e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6e8,"",&local_712);
      local_714[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_6c8 = &local_708;
      local_6c0 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_714);
      __l_21._M_len = local_6c0;
      __l_21._M_array = local_6c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4c8,__l_21,local_714);
      local_795[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_791._1_8_ = &local_788;
      local_518 = (undefined1  [8])&local_4b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_788,"command",local_791);
      local_791._1_8_ = local_768;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_768,"PRINT",&local_792);
      local_791._1_8_ = local_748;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_748,"rvalue",&local_793);
      local_795[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_728 = &local_788;
      local_720 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_795);
      __l_20._M_len = local_720;
      __l_20._M_array = local_728;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_4b0,__l_20,local_795);
      local_836[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_831._1_8_ = &local_828;
      local_518 = (undefined1  [8])&local_498;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_828,"command",local_831);
      local_831._1_8_ = local_808;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_808,"VARIABLE",&local_832);
      local_831._1_8_ = local_7e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7e8,"ASSIGN",&local_833);
      local_831._1_8_ = local_7c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7c8,"rvalue",&local_834);
      local_836[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_7a8 = &local_828;
      local_7a0 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_836);
      __l_19._M_len = local_7a0;
      __l_19._M_array = local_7a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_498,__l_19,local_836);
      local_894[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_891._1_8_ = &local_888;
      local_518 = (undefined1  [8])&local_480;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_888,"command",local_891);
      local_891._1_8_ = local_868;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_868,"function_call",&local_892);
      local_894[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_848 = &local_888;
      local_840 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_894);
      __l_18._M_len = local_840;
      __l_18._M_array = local_848;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_480,__l_18,local_894);
      local_8f4[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_8f1._1_8_ = &local_8e8;
      local_518 = (undefined1  [8])&local_468;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_8e8,"command",local_8f1);
      local_8f1._1_8_ = local_8c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8c8,"return",&local_8f2);
      local_8f4[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_8a8 = &local_8e8;
      local_8a0 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_8f4);
      __l_17._M_len = local_8a0;
      __l_17._M_array = local_8a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_468,__l_17,local_8f4);
      local_996[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_991._1_8_ = &local_988;
      local_518 = (undefined1  [8])&local_450;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_988,"block",local_991);
      local_991._1_8_ = local_968;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_968,"OPEN_CURLY_BRACKET",&local_992);
      local_991._1_8_ = local_948;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_948,"commands",&local_993);
      local_991._1_8_ = local_928;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_928,"CLOSE_CURLY_BRACKET",&local_994);
      local_996[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_908 = &local_988;
      local_900 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_996);
      __l_16._M_len = local_900;
      __l_16._M_array = local_908;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_450,__l_16,local_996);
      local_a36[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_a31._1_8_ = &local_a28;
      local_518 = (undefined1  [8])&local_438;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a28,"function",local_a31);
      local_a31._1_8_ = local_a08;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a08,"FUNCTION",&local_a32);
      local_a31._1_8_ = local_9e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9e8,"parameter_list",&local_a33);
      local_a31._1_8_ = local_9c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9c8,"block",&local_a34);
      local_a36[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_9a8 = &local_a28;
      local_9a0 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_a36);
      __l_15._M_len = local_9a0;
      __l_15._M_array = local_9a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_438,__l_15,local_a36);
      local_ad6[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_ad1._1_8_ = &local_ac8;
      local_518 = (undefined1  [8])&local_420;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ac8,"parameter_list",local_ad1);
      local_ad1._1_8_ = local_aa8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa8,"OPEN_BRACKET",&local_ad2);
      local_ad1._1_8_ = local_a88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a88,"parameters",&local_ad3);
      local_ad1._1_8_ = local_a68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a68,"CLOSE_BRACKET",&local_ad4);
      local_ad6[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_a48 = &local_ac8;
      local_a40 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_ad6);
      __l_14._M_len = local_a40;
      __l_14._M_array = local_a48;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_420,__l_14,local_ad6);
      local_b55[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_b51._1_8_ = &local_b48;
      local_518 = (undefined1  [8])&local_408;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b48,"parameter_list",local_b51);
      local_b51._1_8_ = local_b28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b28,"OPEN_BRACKET",&local_b52);
      local_b51._1_8_ = local_b08;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b08,"CLOSE_BRACKET",&local_b53);
      local_b55[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_ae8 = &local_b48;
      local_ae0 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_b55);
      __l_13._M_len = local_ae0;
      __l_13._M_array = local_ae8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_408,__l_13,local_b55);
      local_bf6[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_bf1._1_8_ = &local_be8;
      local_518 = (undefined1  [8])&local_3f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_be8,"parameters",local_bf1);
      local_bf1._1_8_ = local_bc8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bc8,"parameter",&local_bf2);
      local_bf1._1_8_ = local_ba8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ba8,"COMMA",&local_bf3);
      local_bf1._1_8_ = local_b88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b88,"parameters",&local_bf4);
      local_bf6[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_b68 = &local_be8;
      local_b60 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_bf6);
      __l_12._M_len = local_b60;
      __l_12._M_array = local_b68;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3f0,__l_12,local_bf6);
      local_c54[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_c51._1_8_ = &local_c48;
      local_518 = (undefined1  [8])&local_3d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c48,"parameters",local_c51);
      local_c51._1_8_ = local_c28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c28,"parameter",&local_c52);
      local_c54[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_c08 = &local_c48;
      local_c00 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_c54);
      __l_11._M_len = local_c00;
      __l_11._M_array = local_c08;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3d8,__l_11,local_c54);
      local_cb4[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_cb1._1_8_ = &local_ca8;
      local_518 = (undefined1  [8])&local_3c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ca8,"parameter",local_cb1);
      local_cb1._1_8_ = local_c88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c88,"VARIABLE",&local_cb2);
      local_cb4[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_c68 = &local_ca8;
      local_c60 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_cb4);
      __l_10._M_len = local_c60;
      __l_10._M_array = local_c68;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3c0,__l_10,local_cb4);
      local_d35[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_d31._1_8_ = &local_d28;
      local_518 = (undefined1  [8])&local_3a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d28,"function_call",local_d31);
      local_d31._1_8_ = local_d08;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d08,"VARIABLE",&local_d32);
      local_d31._1_8_ = local_ce8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ce8,"parameter_list",&local_d33);
      local_d35[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_cc8 = &local_d28;
      local_cc0 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_d35);
      __l_09._M_len = local_cc0;
      __l_09._M_array = local_cc8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_3a8,__l_09,local_d35);
      local_db5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_db1._1_8_ = &local_da8;
      local_518 = (undefined1  [8])&local_390;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_da8,"return",local_db1);
      local_db1._1_8_ = local_d88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d88,"RETURN",&local_db2);
      local_db1._1_8_ = local_d68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d68,"rvalue",&local_db3);
      local_db5[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_d48 = &local_da8;
      local_d40 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_db5);
      __l_08._M_len = local_d40;
      __l_08._M_array = local_d48;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_390,__l_08,local_db5);
      local_e56[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_e51._1_8_ = &local_e48;
      local_518 = (undefined1  [8])&local_378;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e48,"rvalue",local_e51);
      local_e51._1_8_ = local_e28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e28,"rvalue",&local_e52);
      local_e51._1_8_ = local_e08;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e08,"SUB",&local_e53);
      local_e51._1_8_ = local_de8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_de8,"rvalue",&local_e54);
      local_e56[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_dc8 = &local_e48;
      local_dc0 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_e56);
      __l_07._M_len = local_dc0;
      __l_07._M_array = local_dc8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_378,__l_07,local_e56);
      local_ef6[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_ef1._1_8_ = &local_ee8;
      local_518 = (undefined1  [8])&local_360;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ee8,"rvalue",local_ef1);
      local_ef1._1_8_ = local_ec8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ec8,"rvalue",&local_ef2);
      local_ef1._1_8_ = local_ea8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ea8,"ADD",&local_ef3);
      local_ef1._1_8_ = local_e88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e88,"rvalue",&local_ef4);
      local_ef6[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_e68 = &local_ee8;
      local_e60 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_ef6);
      __l_06._M_len = local_e60;
      __l_06._M_array = local_e68;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_360,__l_06,local_ef6);
      local_f96[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x1;
      local_f91._1_8_ = &local_f88;
      local_518 = (undefined1  [8])&local_348;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f88,"rvalue",local_f91);
      local_f91._1_8_ = local_f68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f68,"rvalue",&local_f92);
      local_f91._1_8_ = local_f48;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f48,"MUL",&local_f93);
      local_f91._1_8_ = local_f28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f28,"rvalue",&local_f94);
      local_f96[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )0x0;
      local_f08 = &local_f88;
      local_f00 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_f96);
      __l_05._M_len = local_f00;
      __l_05._M_array = local_f08;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_348,__l_05,local_f96);
      local_1036[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x1;
      local_1031._1_8_ = &local_1028;
      local_518 = (undefined1  [8])&local_330;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1028,"rvalue",local_1031);
      local_1031._1_8_ = local_1008;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1008,"rvalue",&local_1032);
      local_1031._1_8_ = local_fe8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_fe8,"DIV",&local_1033);
      local_1031._1_8_ = local_fc8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_fc8,"rvalue",&local_1034);
      local_1036[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      local_fa8 = &local_1028;
      local_fa0 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_1036);
      __l_04._M_len = local_fa0;
      __l_04._M_array = local_fa8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_330,__l_04,local_1036);
      local_10d6[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x1;
      local_10d1._1_8_ = &local_10c8;
      local_518 = (undefined1  [8])&local_318;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_10c8,"rvalue",local_10d1);
      local_10d1._1_8_ = local_10a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10a8,"OPEN_BRACKET",&local_10d2);
      local_10d1._1_8_ = local_1088;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1088,"rvalue",&local_10d3);
      local_10d1._1_8_ = local_1068;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1068,"CLOSE_BRACKET",&local_10d4);
      local_10d6[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      local_1048 = &local_10c8;
      local_1040 = 4;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_10d6);
      __l_03._M_len = local_1040;
      __l_03._M_array = local_1048;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_318,__l_03,local_10d6);
      local_1134[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x1;
      local_1131._1_8_ = &local_1128;
      local_518 = (undefined1  [8])&local_300;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1128,"rvalue",local_1131);
      local_1131._1_8_ = local_1108;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1108,"STRING",&local_1132);
      local_1134[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      local_10e8 = &local_1128;
      local_10e0 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_1134);
      __l_02._M_len = local_10e0;
      __l_02._M_array = local_10e8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_300,__l_02,local_1134);
      local_1194[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x1;
      local_1191._1_8_ = &local_1188;
      local_518 = (undefined1  [8])&local_2e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1188,"rvalue",local_1191);
      local_1191._1_8_ = local_1168;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1168,"NUMBER",&local_1192);
      local_1194[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      local_1148 = &local_1188;
      local_1140 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_1194);
      __l_01._M_len = local_1140;
      __l_01._M_array = local_1148;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2e8,__l_01,local_1194);
      local_11f4[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x1;
      local_11f1._1_8_ = &local_11e8;
      local_518 = (undefined1  [8])&local_2d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_11e8,"rvalue",local_11f1);
      local_11f1._1_8_ = local_11c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_11c8,"VARIABLE",&local_11f2);
      local_11f4[1] =
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )0x0;
      local_11a8 = &local_11e8;
      local_11a0 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(local_11f4);
      __l_00._M_len = local_11a0;
      __l_00._M_array = local_11a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2d0,__l_00,local_11f4);
      table_calculation.non_terminal_first_sets_._M_h._M_single_bucket._5_1_ = 1;
      local_518 = (undefined1  [8])&local_2b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1248,"rvalue",
                 (allocator *)
                 ((long)&table_calculation.non_terminal_first_sets_._M_h._M_single_bucket + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1228,"function",
                 (allocator *)
                 ((long)&table_calculation.non_terminal_first_sets_._M_h._M_single_bucket + 6));
      table_calculation.non_terminal_first_sets_._M_h._M_single_bucket._5_1_ = 0;
      local_1208 = &local_1248;
      local_1200 = 2;
      this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&table_calculation.non_terminal_first_sets_._M_h._M_single_bucket + 4);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(this);
      __l._M_len = local_1200;
      __l._M_array = local_1208;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2b8,__l,this);
      table_calculation.non_terminal_first_sets_._M_h._M_single_bucket._3_1_ = 0;
      local_2a0._0_8_ = local_510;
      local_2a0._8_8_ = (pointer)0x1a;
      this_00 = (allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&table_calculation.non_terminal_first_sets_._M_h._M_single_bucket + 2);
      std::
      allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::allocator(this_00);
      __l_25._M_len = local_2a0._8_8_;
      __l_25._M_array = (iterator)local_2a0._0_8_;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)(local_2a0 + 0x10),__l_25,this_00);
      std::
      allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~allocator((allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&table_calculation.non_terminal_first_sets_._M_h._M_single_bucket + 2))
      ;
      local_1c38 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2a0;
      do {
        local_1c38 = local_1c38 + -1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_1c38);
      } while (local_1c38 !=
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_510);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&table_calculation.non_terminal_first_sets_._M_h._M_single_bucket + 4));
      local_1c50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1208;
      do {
        local_1c50 = local_1c50 + -1;
        std::__cxx11::string::~string((string *)local_1c50);
      } while (local_1c50 != &local_1248);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&table_calculation.non_terminal_first_sets_._M_h._M_single_bucket + 6));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&table_calculation.non_terminal_first_sets_._M_h._M_single_bucket + 7));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_11f4);
      local_1c68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_11a8;
      do {
        local_1c68 = local_1c68 + -1;
        std::__cxx11::string::~string((string *)local_1c68);
      } while (local_1c68 != &local_11e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_11f2);
      std::allocator<char>::~allocator((allocator<char> *)local_11f1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_1194);
      local_1c80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1148;
      do {
        local_1c80 = local_1c80 + -1;
        std::__cxx11::string::~string((string *)local_1c80);
      } while (local_1c80 != &local_1188);
      std::allocator<char>::~allocator((allocator<char> *)&local_1192);
      std::allocator<char>::~allocator((allocator<char> *)local_1191);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_1134);
      local_1c98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10e8;
      do {
        local_1c98 = local_1c98 + -1;
        std::__cxx11::string::~string((string *)local_1c98);
      } while (local_1c98 != &local_1128);
      std::allocator<char>::~allocator((allocator<char> *)&local_1132);
      std::allocator<char>::~allocator((allocator<char> *)local_1131);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_10d6);
      local_1cb0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1048;
      do {
        local_1cb0 = local_1cb0 + -1;
        std::__cxx11::string::~string((string *)local_1cb0);
      } while (local_1cb0 != &local_10c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10d4);
      std::allocator<char>::~allocator((allocator<char> *)&local_10d3);
      std::allocator<char>::~allocator((allocator<char> *)&local_10d2);
      std::allocator<char>::~allocator((allocator<char> *)local_10d1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_1036);
      local_1cc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_fa8;
      do {
        local_1cc8 = local_1cc8 + -1;
        std::__cxx11::string::~string((string *)local_1cc8);
      } while (local_1cc8 != &local_1028);
      std::allocator<char>::~allocator((allocator<char> *)&local_1034);
      std::allocator<char>::~allocator((allocator<char> *)&local_1033);
      std::allocator<char>::~allocator((allocator<char> *)&local_1032);
      std::allocator<char>::~allocator((allocator<char> *)local_1031);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_f96);
      local_1ce0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f08;
      do {
        local_1ce0 = local_1ce0 + -1;
        std::__cxx11::string::~string((string *)local_1ce0);
      } while (local_1ce0 != &local_f88);
      std::allocator<char>::~allocator((allocator<char> *)&local_f94);
      std::allocator<char>::~allocator((allocator<char> *)&local_f93);
      std::allocator<char>::~allocator((allocator<char> *)&local_f92);
      std::allocator<char>::~allocator((allocator<char> *)local_f91);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_ef6);
      local_1cf8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e68;
      do {
        local_1cf8 = local_1cf8 + -1;
        std::__cxx11::string::~string((string *)local_1cf8);
      } while (local_1cf8 != &local_ee8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ef4);
      std::allocator<char>::~allocator((allocator<char> *)&local_ef3);
      std::allocator<char>::~allocator((allocator<char> *)&local_ef2);
      std::allocator<char>::~allocator((allocator<char> *)local_ef1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_e56);
      local_1d10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_dc8;
      do {
        local_1d10 = local_1d10 + -1;
        std::__cxx11::string::~string((string *)local_1d10);
      } while (local_1d10 != &local_e48);
      std::allocator<char>::~allocator((allocator<char> *)&local_e54);
      std::allocator<char>::~allocator((allocator<char> *)&local_e53);
      std::allocator<char>::~allocator((allocator<char> *)&local_e52);
      std::allocator<char>::~allocator((allocator<char> *)local_e51);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_db5);
      local_1d28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d48;
      do {
        local_1d28 = local_1d28 + -1;
        std::__cxx11::string::~string((string *)local_1d28);
      } while (local_1d28 != &local_da8);
      std::allocator<char>::~allocator((allocator<char> *)&local_db3);
      std::allocator<char>::~allocator((allocator<char> *)&local_db2);
      std::allocator<char>::~allocator((allocator<char> *)local_db1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_d35);
      local_1d40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_cc8;
      do {
        local_1d40 = local_1d40 + -1;
        std::__cxx11::string::~string((string *)local_1d40);
      } while (local_1d40 != &local_d28);
      std::allocator<char>::~allocator((allocator<char> *)&local_d33);
      std::allocator<char>::~allocator((allocator<char> *)&local_d32);
      std::allocator<char>::~allocator((allocator<char> *)local_d31);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_cb4);
      local_1d58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c68;
      do {
        local_1d58 = local_1d58 + -1;
        std::__cxx11::string::~string((string *)local_1d58);
      } while (local_1d58 != &local_ca8);
      std::allocator<char>::~allocator((allocator<char> *)&local_cb2);
      std::allocator<char>::~allocator((allocator<char> *)local_cb1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_c54);
      local_1d70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c08;
      do {
        local_1d70 = local_1d70 + -1;
        std::__cxx11::string::~string((string *)local_1d70);
      } while (local_1d70 != &local_c48);
      std::allocator<char>::~allocator((allocator<char> *)&local_c52);
      std::allocator<char>::~allocator((allocator<char> *)local_c51);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_bf6);
      local_1d88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b68;
      do {
        local_1d88 = local_1d88 + -1;
        std::__cxx11::string::~string((string *)local_1d88);
      } while (local_1d88 != &local_be8);
      std::allocator<char>::~allocator((allocator<char> *)&local_bf4);
      std::allocator<char>::~allocator((allocator<char> *)&local_bf3);
      std::allocator<char>::~allocator((allocator<char> *)&local_bf2);
      std::allocator<char>::~allocator((allocator<char> *)local_bf1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_b55);
      local_1da0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_ae8;
      do {
        local_1da0 = local_1da0 + -1;
        std::__cxx11::string::~string((string *)local_1da0);
      } while (local_1da0 != &local_b48);
      std::allocator<char>::~allocator((allocator<char> *)&local_b53);
      std::allocator<char>::~allocator((allocator<char> *)&local_b52);
      std::allocator<char>::~allocator((allocator<char> *)local_b51);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_ad6);
      local_1db8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a48;
      do {
        local_1db8 = local_1db8 + -1;
        std::__cxx11::string::~string((string *)local_1db8);
      } while (local_1db8 != &local_ac8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ad4);
      std::allocator<char>::~allocator((allocator<char> *)&local_ad3);
      std::allocator<char>::~allocator((allocator<char> *)&local_ad2);
      std::allocator<char>::~allocator((allocator<char> *)local_ad1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_a36);
      local_1dd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_9a8;
      do {
        local_1dd0 = local_1dd0 + -1;
        std::__cxx11::string::~string((string *)local_1dd0);
      } while (local_1dd0 != &local_a28);
      std::allocator<char>::~allocator((allocator<char> *)&local_a34);
      std::allocator<char>::~allocator((allocator<char> *)&local_a33);
      std::allocator<char>::~allocator((allocator<char> *)&local_a32);
      std::allocator<char>::~allocator((allocator<char> *)local_a31);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_996);
      local_1de8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_908;
      do {
        local_1de8 = local_1de8 + -1;
        std::__cxx11::string::~string((string *)local_1de8);
      } while (local_1de8 != &local_988);
      std::allocator<char>::~allocator((allocator<char> *)&local_994);
      std::allocator<char>::~allocator((allocator<char> *)&local_993);
      std::allocator<char>::~allocator((allocator<char> *)&local_992);
      std::allocator<char>::~allocator((allocator<char> *)local_991);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_8f4);
      local_1e00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_8a8;
      do {
        local_1e00 = local_1e00 + -1;
        std::__cxx11::string::~string((string *)local_1e00);
      } while (local_1e00 != &local_8e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8f2);
      std::allocator<char>::~allocator((allocator<char> *)local_8f1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_894);
      local_1e18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_848;
      do {
        local_1e18 = local_1e18 + -1;
        std::__cxx11::string::~string((string *)local_1e18);
      } while (local_1e18 != &local_888);
      std::allocator<char>::~allocator((allocator<char> *)&local_892);
      std::allocator<char>::~allocator((allocator<char> *)local_891);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_836);
      local_1e30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7a8;
      do {
        local_1e30 = local_1e30 + -1;
        std::__cxx11::string::~string((string *)local_1e30);
      } while (local_1e30 != &local_828);
      std::allocator<char>::~allocator((allocator<char> *)&local_834);
      std::allocator<char>::~allocator((allocator<char> *)&local_833);
      std::allocator<char>::~allocator((allocator<char> *)&local_832);
      std::allocator<char>::~allocator((allocator<char> *)local_831);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_795);
      local_1e48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_728;
      do {
        local_1e48 = local_1e48 + -1;
        std::__cxx11::string::~string((string *)local_1e48);
      } while (local_1e48 != &local_788);
      std::allocator<char>::~allocator((allocator<char> *)&local_793);
      std::allocator<char>::~allocator((allocator<char> *)&local_792);
      std::allocator<char>::~allocator((allocator<char> *)local_791);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_714);
      local_1e60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6c8;
      do {
        local_1e60 = local_1e60 + -1;
        std::__cxx11::string::~string((string *)local_1e60);
      } while (local_1e60 != &local_708);
      std::allocator<char>::~allocator((allocator<char> *)&local_712);
      std::allocator<char>::~allocator((allocator<char> *)local_711);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_6b5);
      local_1e78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_648;
      do {
        local_1e78 = local_1e78 + -1;
        std::__cxx11::string::~string((string *)local_1e78);
      } while (local_1e78 != &local_6a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b3);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b2);
      std::allocator<char>::~allocator((allocator<char> *)local_6b1);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_636);
      local_1e90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5a8;
      do {
        local_1e90 = local_1e90 + -1;
        std::__cxx11::string::~string((string *)local_1e90);
      } while (local_1e90 != &local_628);
      std::allocator<char>::~allocator((allocator<char> *)&local_634);
      std::allocator<char>::~allocator((allocator<char> *)&local_633);
      std::allocator<char>::~allocator((allocator<char> *)&local_632);
      std::allocator<char>::~allocator((allocator<char> *)local_631);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(local_595);
      local_1ea8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_528;
      do {
        local_1ea8 = local_1ea8 + -1;
        std::__cxx11::string::~string((string *)local_1ea8);
      } while (local_1ea8 != &local_588);
      std::allocator<char>::~allocator((allocator<char> *)&local_593);
      std::allocator<char>::~allocator((allocator<char> *)&local_592);
      std::allocator<char>::~allocator((allocator<char> *)local_591);
      ParseTableCalculation::ParseTableCalculation
                ((ParseTableCalculation *)
                 &table.
                  super__Vector_base<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)(local_2a0 + 0x10),(bool)(local_161 & 1));
      ParseTableCalculation::calculateTable
                ((vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                  *)((long)&parser.tree_nodes_stack_.c.
                            super__Deque_base<ASTNode,_std::allocator<ASTNode>_>._M_impl.
                            super__Deque_impl_data._M_finish + 0x18),
                 (ParseTableCalculation *)
                 &table.
                  super__Vector_base<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __nbytes = (ulong)(local_1a1 & 1);
      Parser::Parser((Parser *)&tokenizer.current_line_index_,
                     (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)(local_2a0 + 0x10),
                     (vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                      *)((long)&parser.tree_nodes_stack_.c.
                                super__Deque_base<ASTNode,_std::allocator<ASTNode>_>._M_impl.
                                super__Deque_impl_data._M_finish + 0x18),SUB41(local_1a1 & 1,0));
      Tokenizer::Tokenizer
                ((Tokenizer *)((long)&token.field_2 + 8),
                 (string *)
                 &rules.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::string((string *)(read_string.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_1438);
      do {
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&read_string.field_2 + 8),"EOF");
        if (!bVar1) {
          if ((local_219 & 1) != 0) {
            Parser::printAST((Parser *)&tokenizer.current_line_index_);
          }
          argv_local._4_4_ = 0;
          it_filename.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur._4_4_ = 1;
          goto LAB_00188f2c;
        }
        line.field_2._M_local_buf[0xf] =
             Tokenizer::getNextToken
                       ((Tokenizer *)((long)&token.field_2 + 8),
                        (string *)((long)&read_string.field_2 + 8),(string *)local_1438);
        if ((local_122 & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   (string *)(read_string.field_2._M_local_buf + 8));
          poVar4 = std::operator<<(poVar4," [");
          poVar4 = std::operator<<(poVar4,(string *)local_1438);
          poVar4 = std::operator<<(poVar4,"]");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        if ((line.field_2._M_local_buf[0xf] & 1U) != 0) {
          sVar5 = Parser::read((Parser *)&tokenizer.current_line_index_,(int)&read_string + 0x18,
                               local_1438,__nbytes);
          line.field_2._M_local_buf[0xf] = (byte)sVar5 & 1;
        }
      } while ((line.field_2._M_local_buf[0xf] & 1U) != 0);
      iVar2 = Tokenizer::getCurrentLine((Tokenizer *)((long)&token.field_2 + 8));
      std::__cxx11::to_string((string *)local_1460,iVar2 + 1);
      std::operator+(&local_14e0,"An error occurred on line ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1460
                    );
      std::operator+(&local_14c0,&local_14e0," when parsing [");
      std::operator+(&local_14a0,&local_14c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1438
                    );
      std::operator+(&local_1480,&local_14a0,"]");
      printError(&local_1480);
      std::__cxx11::string::~string((string *)&local_1480);
      std::__cxx11::string::~string((string *)&local_14a0);
      std::__cxx11::string::~string((string *)&local_14c0);
      std::__cxx11::string::~string((string *)&local_14e0);
      argv_local._4_4_ = 1;
      it_filename.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_4_ = 1;
      std::__cxx11::string::~string((string *)local_1460);
LAB_00188f2c:
      std::__cxx11::string::~string((string *)local_1438);
      std::__cxx11::string::~string((string *)(read_string.field_2._M_local_buf + 8));
      Tokenizer::~Tokenizer((Tokenizer *)((long)&token.field_2 + 8));
      Parser::~Parser((Parser *)&tokenizer.current_line_index_);
      std::
      vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
      ::~vector((vector<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                 *)((long)&parser.tree_nodes_stack_.c.
                           super__Deque_base<ASTNode,_std::allocator<ASTNode>_>._M_impl.
                           super__Deque_impl_data._M_finish + 0x18));
      ParseTableCalculation::~ParseTableCalculation
                ((ParseTableCalculation *)
                 &table.
                  super__Vector_base<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>,_std::allocator<std::vector<ParseTableEntry,_std::allocator<ParseTableEntry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)(local_2a0 + 0x10));
      std::__cxx11::string::~string
                ((string *)
                 &rules.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_50);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	auto args = parseArguments("filename", argc, argv);

	if (args.find("help") != args.end())
	{
		printHelp();
		return 0;
	}

	auto it_filename = args.find("filename");
	if (it_filename == args.end())
	{
		std::cout << std::endl;
		printError("No file provided");
		printHelp();
		return -1;
	}

	bool print_tokenizer_debug = args.find("tokenizer_debug") != args.end();
	bool print_table_calculation_debug = args.find("table_debug") != args.end();
	bool print_parser_debug = args.find("parser_debug") != args.end();
	if (args.find("debug") != args.end())
	{
		print_tokenizer_debug = true;
		print_table_calculation_debug = true;
		print_parser_debug = true;
	}
	bool print_ast = args.find("ast") != args.end();
	std::string filename = it_filename->second;

	std::vector<std::vector<std::string>> rules = {
		{"program", "commands", "EOF"},
		{"commands", "command", "SEMICOLON", "commands"},
		{"commands", "block", "commands"},
		{"commands", ""},
		{"command", "PRINT", "rvalue"},
		{"command", "VARIABLE", "ASSIGN", "rvalue"},
		{"command", "function_call"},
		{"command", "return"},
		{"block", "OPEN_CURLY_BRACKET", "commands", "CLOSE_CURLY_BRACKET"},
		{"function", "FUNCTION", "parameter_list", "block"},
		{"parameter_list", "OPEN_BRACKET", "parameters", "CLOSE_BRACKET"},
		{"parameter_list", "OPEN_BRACKET", "CLOSE_BRACKET"},
		{"parameters", "parameter", "COMMA", "parameters"},
		{"parameters", "parameter"},
		{"parameter", "VARIABLE"},
		{"function_call", "VARIABLE", "parameter_list"},
		{"return", "RETURN", "rvalue"},
		{"rvalue", "rvalue", "SUB", "rvalue"},
		{"rvalue", "rvalue", "ADD", "rvalue"},
		{"rvalue", "rvalue", "MUL", "rvalue"},
		{"rvalue", "rvalue", "DIV", "rvalue"},
		{"rvalue", "OPEN_BRACKET", "rvalue", "CLOSE_BRACKET"},
		{"rvalue", "STRING"},
		{"rvalue", "NUMBER"},
		{"rvalue", "VARIABLE"},
		{"rvalue", "function"}

	};
	ParseTableCalculation table_calculation(rules, print_table_calculation_debug);
	auto table = table_calculation.calculateTable();
	Parser parser(rules, table, print_parser_debug);

	Tokenizer tokenizer(filename);
	std::string token, read_string;
	while (token != "EOF")
	{
		bool success = tokenizer.getNextToken(token, read_string);
		if (print_tokenizer_debug)
		{
			std::cout << token << " [" << read_string << "]" << std::endl;
		}
		if (success)
		{
			success = parser.read(token, read_string);
		}
		if (!success)
		{
			std::string line = std::to_string(tokenizer.getCurrentLine() + 1);
			printError("An error occurred on line " + line + " when parsing [" + read_string + "]");
			return 1;
		}
	}
	if (print_ast)
	{
		parser.printAST();
	}
	return 0;
}